

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

void __thiscall TempData::writeLine(TempData *this,int64_t memoryAddress,string *text)

{
  bool bVar1;
  ulong uVar2;
  string *fmt;
  int *in_R8;
  string local_80;
  undefined1 local_50 [8];
  string str;
  char hexbuf [10];
  string *text_local;
  int64_t memoryAddress_local;
  TempData *this_local;
  
  bVar1 = TextFile::isOpen(&this->file);
  if (bVar1) {
    memset((void *)((long)&str.field_2 + 0xe),0,10);
    snprintf(str.field_2._M_local_buf + 0xe,10,"%08X ",memoryAddress & 0xffffffff);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   str.field_2._M_local_buf + 0xe,text);
    while (uVar2 = std::__cxx11::string::size(), uVar2 < 0x46) {
      std::__cxx11::string::operator+=((string *)local_50,' ');
    }
    fmt = FileList::string_abi_cxx11_(&Global.fileList,Global.FileInfo.FileNum);
    tinyformat::format<std::__cxx11::string,int>
              (&local_80,(tinyformat *)"; %S line %d",(char *)fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &Global.FileInfo.LineNumber,in_R8);
    std::__cxx11::string::operator+=((string *)local_50,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    TextFile::writeLine(&this->file,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void TempData::writeLine(int64_t memoryAddress, const std::string& text)
{
	if (file.isOpen())
	{
		char hexbuf[10] = {0};
		snprintf(hexbuf, 10, "%08X ", (int32_t) memoryAddress);
		std::string str = hexbuf + text;
		while (str.size() < 70)
			str += ' ';

		str += tfm::format("; %S line %d",
			Global.fileList.string(Global.FileInfo.FileNum),Global.FileInfo.LineNumber);

		file.writeLine(str);
	}
}